

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O2

void gdImageSkewY(gdImagePtr dst,gdImagePtr src,int uCol,int iOffset,double dWeight,int clrBack,
                 int ignoretransparent)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint color;
  code *pcVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int g;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int r;
  int a;
  int b;
  
  iVar9 = src->trueColor;
  for (iVar10 = 0; iVar10 <= iOffset; iVar10 = iVar10 + 1) {
    gdImageSetPixel(dst,uCol,iVar10,clrBack);
  }
  if (iVar9 == 0) {
    pcVar6 = gdImageGetPixel;
  }
  else {
    pcVar6 = gdImageGetTrueColorPixel;
  }
  if (src->trueColor == 0) {
    uVar3 = src->red[clrBack];
    uVar4 = src->green[clrBack];
    uVar8 = src->blue[clrBack];
    uVar5 = src->alpha[clrBack];
  }
  else {
    uVar3 = (uint)clrBack >> 0x10 & 0xff;
    uVar4 = (uint)clrBack >> 8 & 0xff;
    uVar8 = clrBack & 0xff;
    uVar5 = (uint)clrBack >> 0x18 & 0x7f;
  }
  uVar4 = gdImageColorAllocateAlpha
                    (dst,(int)((double)(int)uVar3 * dWeight),(int)((double)(int)uVar4 * dWeight),
                     (int)((double)(int)uVar8 * dWeight),(int)((double)(int)uVar5 * dWeight));
  iVar10 = 0;
  uVar3 = 0;
  for (iVar9 = 0; iVar9 < src->sy; iVar9 = iVar9 + 1) {
    uVar7 = (*pcVar6)(src,uCol);
    color = (uint)uVar7;
    uVar5 = (uint)((ulong)uVar7 >> 8);
    uVar8 = (uint)((ulong)uVar7 >> 0x10);
    uVar3 = (uint)((ulong)uVar7 >> 0x18);
    if (src->trueColor == 0) {
      uVar12 = src->red[(int)color];
      uVar13 = src->green[(int)color];
      uVar14 = src->blue[(int)color];
      uVar15 = src->alpha[(int)color];
    }
    else {
      uVar12 = uVar8 & 0xff;
      uVar13 = uVar5 & 0xff;
      uVar14 = color & 0xff;
      uVar15 = uVar3 & 0x7f;
    }
    iVar11 = (int)((double)(int)uVar12 * dWeight);
    iVar16 = (int)((double)(int)uVar15 * dWeight);
    if (0xfe < iVar11) {
      iVar11 = 0xff;
    }
    iVar1 = (int)((double)(int)uVar13 * dWeight);
    if (0xfe < (int)((double)(int)uVar13 * dWeight)) {
      iVar1 = 0xff;
    }
    iVar2 = (int)((double)(int)uVar14 * dWeight);
    if (0xfe < (int)((double)(int)uVar14 * dWeight)) {
      iVar2 = 0xff;
    }
    if (0x7e < iVar16) {
      iVar16 = 0x7f;
    }
    iVar10 = 0xff;
    if (src->trueColor == 0) {
      r = (src->red[(int)color] - iVar11) + src->red[(int)uVar4];
      g = (src->green[(int)color] - iVar1) + src->green[(int)uVar4];
      b = (src->blue[(int)color] - iVar2) + src->blue[(int)uVar4];
      uVar3 = src->alpha[(int)color];
      uVar4 = src->alpha[(int)uVar4];
    }
    else {
      r = ((uVar4 >> 0x10 & 0xff) + (uVar8 & 0xff)) - iVar11;
      g = ((uVar4 >> 8 & 0xff) + (uVar5 & 0xff)) - iVar1;
      b = ((uVar4 & 0xff) + (color & 0xff)) - iVar2;
      uVar3 = uVar3 & 0x7f;
      uVar4 = uVar4 >> 0x18 & 0x7f;
    }
    a = (uVar3 - iVar16) + uVar4;
    if (0xfe < r) {
      r = iVar10;
    }
    if (0xfe < g) {
      g = iVar10;
    }
    if (0xfe < b) {
      b = iVar10;
    }
    if (0x7e < a) {
      a = 0x7f;
    }
    if ((ignoretransparent == 0) || (color != dst->transparent)) {
      color = gdImageColorAllocateAlpha(dst,r,g,b,a);
      if (color == 0xffffffff) {
        color = gdImageColorClosestAlpha(dst,r,g,b,a);
      }
    }
    iVar10 = iOffset + iVar9;
    if ((-1 < iVar10) && (iVar10 < dst->sy)) {
      gdImageSetPixel(dst,uCol,iVar10,color);
    }
    uVar4 = iVar11 * 0x10000 + iVar2 + iVar1 * 0x100 + iVar16 * 0x1000000;
    uVar3 = uVar4;
  }
  if (iVar10 < dst->sy) {
    gdImageSetPixel(dst,uCol,iVar10,uVar3);
  }
  for (; iVar10 < dst->sy; iVar10 = iVar10 + 1) {
    gdImageSetPixel(dst,uCol,iVar10,clrBack);
  }
  return;
}

Assistant:

void gdImageSkewY (gdImagePtr dst, gdImagePtr src, int uCol, int iOffset, double dWeight, int clrBack, int ignoretransparent)
{
	int i, iYPos=0, r, g, b, a;
	FuncPtr f;
	int pxlOldLeft, pxlLeft=0, pxlSrc;

	if (src->trueColor) {
		f = gdImageGetTrueColorPixel;
	} else {
		f = gdImageGetPixel;
	}

	for (i = 0; i<=iOffset; i++) {
		gdImageSetPixel (dst, uCol, i, clrBack);
	}
	r = (int)((double)gdImageRed(src,clrBack) * dWeight);
	g = (int)((double)gdImageGreen(src,clrBack) * dWeight);
	b = (int)((double)gdImageBlue(src,clrBack) * dWeight);
	a = (int)((double)gdImageAlpha(src,clrBack) * dWeight);

	pxlOldLeft = gdImageColorAllocateAlpha(dst, r, g, b, a);

	for (i = 0; i < src->sy; i++) {
		pxlSrc = f (src, uCol, i);
		iYPos = i + iOffset;

		r = (int)((double)gdImageRed(src,pxlSrc) * dWeight);
		g = (int)((double)gdImageGreen(src,pxlSrc) * dWeight);
		b = (int)((double)gdImageBlue(src,pxlSrc) * dWeight);
		a = (int)((double)gdImageAlpha(src,pxlSrc) * dWeight);

		if (r>255) {
        	r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
    			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		pxlLeft = gdTrueColorAlpha(r, g, b, a);

		r = gdImageRed(src,pxlSrc)   - (r - gdImageRed(src,pxlOldLeft));
		g = gdImageGreen(src,pxlSrc) - (g - gdImageGreen(src,pxlOldLeft));
		b = gdImageBlue(src,pxlSrc)  - (b - gdImageBlue(src,pxlOldLeft));
		a = gdImageAlpha(src,pxlSrc) - (a - gdImageAlpha(src,pxlOldLeft));

		if (r>255) {
        	r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
    			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		if (ignoretransparent && pxlSrc == dst->transparent) {
			pxlSrc = dst->transparent;
		} else {
			pxlSrc = gdImageColorAllocateAlpha(dst, r, g, b, a);

			if (pxlSrc == -1) {
				pxlSrc = gdImageColorClosestAlpha(dst, r, g, b, a);
			}
		}

		if ((iYPos >= 0) && (iYPos < dst->sy)) {
			gdImageSetPixel (dst, uCol, iYPos, pxlSrc);
		}

		pxlOldLeft = pxlLeft;
	}

	i = iYPos;
	if (i < dst->sy) {
		gdImageSetPixel (dst, uCol, i, pxlLeft);
	}

	i--;
	while (++i < dst->sy) {
		gdImageSetPixel (dst, uCol, i, clrBack);
	}
}